

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O3

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  void *pvVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  void *pvVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  int l;
  uint uVar34;
  void *pvVar35;
  int ki;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  bool bVar40;
  float fVar41;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  ulong local_200;
  void *local_1f8;
  int local_1f0;
  int local_1ec;
  void *local_1d8;
  void *local_1c8;
  void *local_1b8;
  allocator_type local_169;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  long local_150;
  ulong local_148;
  long local_140;
  ulong local_138;
  ulong local_130;
  Mat local_128;
  void *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  iVar19 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  iVar3 = bottom_blob->d;
  uVar4 = bottom_blob->c;
  uVar39 = (ulong)uVar4;
  sVar6 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_128.cstep = 0;
      local_128.data = (void *)0x0;
      local_128.refcount._0_4_ = 0;
      local_128.refcount._4_4_ = 0;
      local_128.elemsize._0_4_ = 0;
      local_128.elemsize._4_4_ = 0;
      local_128.elempack = 0;
      local_128.allocator = (Allocator *)0x0;
      local_128.dims = 0;
      local_128.w = 0;
      local_128.h = 0;
      local_128.d = 0;
      local_128.c = 0;
      local_78.lightmode = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78.num_threads = opt->num_threads;
      local_78.blob_allocator = opt->blob_allocator;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      uVar25._0_1_ = opt->use_bf16_storage;
      uVar25._1_1_ = opt->use_fp16_packed;
      uVar25._2_1_ = opt->use_fp16_storage;
      uVar25._3_1_ = opt->use_fp16_arithmetic;
      uVar25._4_1_ = opt->use_int8_packed;
      uVar25._5_1_ = opt->use_int8_storage;
      uVar25._6_1_ = opt->use_int8_arithmetic;
      uVar25._7_1_ = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_reserved_0 = opt->use_reserved_0;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_shader_local_memory = opt->use_shader_local_memory;
      local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
      local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
      local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
      local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
      local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78._32_8_ = uVar25 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_128,&local_78);
      iVar2 = local_128.h;
      iVar19 = local_128.w;
      iVar24 = -100;
      if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
        iVar5 = local_128.d;
        iVar3 = (local_128.w - this->kernel_w) / this->stride_w;
        uVar25 = (long)(local_128.h - this->kernel_h) / (long)this->stride_h;
        local_130 = uVar25 & 0xffffffff;
        uVar34 = iVar3 + 1;
        uVar36 = (int)uVar25 + 1;
        uVar25 = (long)(local_128.d - this->kernel_d) / (long)this->stride_d;
        local_160 = uVar25 & 0xffffffff;
        uVar32 = (int)uVar25 + 1;
        Mat::create(top_blob,uVar34,uVar36,uVar32,uVar4,sVar6,(Allocator *)0x0);
        iVar24 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar25 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_90,uVar25,&local_169);
          iVar24 = this->kernel_d;
          if (0 < iVar24) {
            iVar31 = this->kernel_w;
            iVar11 = this->kernel_h;
            iVar22 = iVar19 - iVar31;
            iVar29 = iVar2 - iVar11;
            iVar18 = 0;
            iVar12 = 0;
            iVar30 = 0;
            do {
              if (0 < iVar11) {
                iVar24 = 0;
                do {
                  if (0 < iVar31) {
                    lVar15 = 0;
                    do {
                      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar30 + lVar15] = iVar12 + (int)lVar15;
                      iVar31 = this->kernel_w;
                      lVar15 = lVar15 + 1;
                      iVar13 = (int)lVar15;
                    } while (iVar13 < iVar31);
                    iVar30 = iVar30 + iVar13;
                    iVar11 = this->kernel_h;
                    iVar12 = iVar12 + iVar13;
                  }
                  iVar12 = iVar12 + iVar22;
                  iVar24 = iVar24 + 1;
                } while (iVar24 < iVar11);
                iVar24 = this->kernel_d;
              }
              iVar12 = iVar12 + iVar29 * iVar19;
              iVar18 = iVar18 + 1;
            } while (iVar18 < iVar24);
          }
          iVar24 = (int)uVar25;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              local_1ec = 0;
              local_1f0 = 0;
              iVar24 = 0;
              if (this->pad_mode == 0) {
                local_1ec = (bottom_blob->w - local_128.w) + this->pad_left + this->pad_right;
                local_1f0 = (bottom_blob->h - local_128.h) + this->pad_top + this->pad_bottom;
                iVar24 = (bottom_blob->d - local_128.d) + this->pad_front + this->pad_behind;
              }
              if (0 < (int)uVar4) {
                local_e0 = local_128.data;
                local_d0 = top_blob->data;
                local_d8 = top_blob->cstep * top_blob->elemsize;
                local_c0 = (long)this->stride_d;
                local_150 = (long)(int)uVar34;
                local_b0 = (ulong)uVar32;
                local_158 = (ulong)uVar36;
                local_148 = (ulong)uVar34;
                local_c8 = local_128.cstep *
                           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
                lVar15 = (long)local_128.w *
                         CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
                local_b8 = local_128.h * lVar15 * local_c0;
                local_138 = 0;
                do {
                  if (-1 < (int)local_160) {
                    local_1b8 = (void *)(local_d8 * local_138 + (long)local_d0);
                    local_98 = (long)this->stride_h;
                    pvVar35 = local_e0;
                    uVar25 = 0;
                    do {
                      local_a8 = uVar25;
                      local_a0 = pvVar35;
                      if (-1 < (int)local_130) {
                        iVar31 = this->stride_w;
                        uVar4 = this->kernel_d;
                        local_140 = (long)iVar31 * 4;
                        local_168 = 0;
                        local_1c8 = local_a0;
                        do {
                          if (-1 < iVar3) {
                            iVar11 = this->pad_front;
                            lVar21 = 0;
                            uVar25 = 0;
                            pvVar35 = local_1c8;
                            do {
                              fVar41 = NAN;
                              if (0 < (int)uVar4) {
                                fVar41 = 0.0;
                                uVar27 = 0;
                                iVar22 = 0;
                                pvVar20 = pvVar35;
                                do {
                                  lVar26 = local_a8 * local_c0 + uVar27;
                                  if (iVar11 <= lVar26) {
                                    if ((iVar24 + iVar5) - this->pad_behind <= lVar26) break;
                                    if (0 < this->kernel_h) {
                                      uVar14 = 0;
                                      pvVar28 = pvVar20;
                                      do {
                                        lVar26 = local_168 * local_98 + uVar14;
                                        if (this->pad_top <= lVar26) {
                                          if ((local_1f0 + iVar2) - this->pad_bottom <= lVar26)
                                          break;
                                          if (0 < this->kernel_w) {
                                            uVar16 = 0;
                                            do {
                                              if ((long)this->pad_left <= (long)(lVar21 + uVar16)) {
                                                if ((long)((local_1ec + iVar19) - this->pad_right)
                                                    <= (long)(lVar21 + uVar16)) break;
                                                fVar41 = fVar41 + *(float *)((long)pvVar28 +
                                                                            uVar16 * 4);
                                                iVar22 = iVar22 + 1;
                                              }
                                              uVar16 = uVar16 + 1;
                                            } while ((uint)this->kernel_w != uVar16);
                                          }
                                        }
                                        uVar14 = uVar14 + 1;
                                        pvVar28 = (void *)((long)pvVar28 + lVar15);
                                      } while (uVar14 != (uint)this->kernel_h);
                                    }
                                  }
                                  uVar27 = uVar27 + 1;
                                  pvVar20 = (void *)((long)pvVar20 + local_128.h * lVar15);
                                } while (uVar27 != uVar4);
                                fVar41 = fVar41 / (float)iVar22;
                              }
                              *(float *)((long)local_1b8 + uVar25 * 4) = fVar41;
                              uVar25 = uVar25 + 1;
                              pvVar35 = (void *)((long)pvVar35 + local_140);
                              lVar21 = lVar21 + iVar31;
                            } while (uVar25 != local_148);
                          }
                          local_1b8 = (void *)((long)local_1b8 + local_150 * 4);
                          local_168 = local_168 + 1;
                          local_1c8 = (void *)((long)local_1c8 + lVar15 * local_98);
                        } while (local_168 != local_158);
                      }
                      pvVar35 = (void *)((long)local_a0 + local_b8);
                      uVar25 = local_a8 + 1;
                    } while (local_a8 + 1 != local_b0);
                  }
                  local_138 = local_138 + 1;
                  local_e0 = (void *)((long)local_e0 + local_c8);
                } while (local_138 != uVar39);
              }
            }
            else if (0 < (int)uVar4) {
              pvVar35 = top_blob->data;
              sVar6 = top_blob->cstep;
              sVar7 = top_blob->elemsize;
              lVar15 = (long)local_128.w *
                       CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
              local_200 = 0;
              do {
                if (-1 < (int)local_160) {
                  pvVar20 = (void *)(sVar6 * sVar7 * local_200 + (long)pvVar35);
                  iVar19 = 0;
                  do {
                    if (-1 < (int)local_130) {
                      iVar2 = this->stride_d;
                      iVar5 = this->stride_h;
                      iVar31 = this->stride_w;
                      uVar27 = 0;
                      do {
                        if (-1 < iVar3) {
                          uVar14 = 0;
                          do {
                            if (iVar24 < 1) {
                              fVar41 = 0.0;
                            }
                            else {
                              fVar41 = 0.0;
                              uVar16 = 0;
                              do {
                                fVar41 = fVar41 + *(float *)((long)local_128.data +
                                                            (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar16] *
                                                  4 + uVar14 * (long)iVar31 * 4 +
                                                      uVar27 * iVar5 * lVar15 +
                                                      (long)iVar19 * (long)iVar2 *
                                                      local_128.h * lVar15 +
                                                      local_128.cstep *
                                                      CONCAT44(local_128.elemsize._4_4_,
                                                               (undefined4)local_128.elemsize) *
                                                      local_200);
                                uVar16 = uVar16 + 1;
                              } while ((uVar25 & 0xffffffff) != uVar16);
                            }
                            *(float *)((long)pvVar20 + uVar14 * 4) = fVar41 * (1.0 / (float)iVar24);
                            uVar14 = uVar14 + 1;
                          } while (uVar14 != uVar34);
                        }
                        pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar34 * 4);
                        uVar27 = uVar27 + 1;
                      } while (uVar27 != uVar36);
                    }
                    bVar40 = iVar19 != (int)local_160;
                    iVar19 = iVar19 + 1;
                  } while (bVar40);
                }
                local_200 = local_200 + 1;
              } while (local_200 != uVar39);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar4)) {
            sVar6 = top_blob->cstep;
            sVar7 = top_blob->elemsize;
            pvVar35 = top_blob->data;
            lVar15 = (long)local_128.w *
                     CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
            local_200 = 0;
            do {
              if (-1 < (int)local_160) {
                pvVar20 = (void *)(sVar6 * sVar7 * local_200 + (long)pvVar35);
                iVar19 = 0;
                do {
                  if (-1 < (int)local_130) {
                    iVar2 = this->stride_d;
                    iVar5 = this->stride_h;
                    iVar31 = this->stride_w;
                    uVar27 = 0;
                    do {
                      if (-1 < iVar3) {
                        lVar21 = uVar27 * iVar5 * lVar15 +
                                 (long)iVar19 * (long)iVar2 * local_128.h * lVar15 +
                                 local_128.cstep *
                                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) *
                                 local_200;
                        uVar14 = 0;
                        do {
                          lVar26 = uVar14 * (long)iVar31;
                          fVar41 = *(float *)((long)local_128.data + lVar26 * 4 + lVar21);
                          if (0 < iVar24) {
                            uVar16 = 0;
                            do {
                              fVar1 = *(float *)((long)local_128.data +
                                                (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar16] *
                                                4 + lVar26 * 4 + lVar21);
                              if (fVar41 <= fVar1) {
                                fVar41 = fVar1;
                              }
                              uVar16 = uVar16 + 1;
                            } while ((uVar25 & 0xffffffff) != uVar16);
                          }
                          *(float *)((long)pvVar20 + uVar14 * 4) = fVar41;
                          uVar14 = uVar14 + 1;
                        } while (uVar14 != uVar34);
                      }
                      pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar34 * 4);
                      uVar27 = uVar27 + 1;
                    } while (uVar27 != uVar36);
                  }
                  bVar40 = iVar19 != (int)local_160;
                  iVar19 = iVar19 + 1;
                } while (bVar40);
              }
              local_200 = local_200 + 1;
            } while (local_200 != uVar39);
          }
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar24 = 0;
        }
      }
      piVar10 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            if (local_128.data != (void *)0x0) {
              free(local_128.data);
            }
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,this->out_h,this->out_d,uVar4,sVar6,opt->blob_allocator);
      pvVar35 = top_blob->data;
      iVar24 = -100;
      if ((pvVar35 != (void *)0x0) && (sVar6 = top_blob->cstep, (long)top_blob->c * sVar6 != 0)) {
        iVar24 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar4) {
            sVar7 = bottom_blob->cstep;
            sVar8 = bottom_blob->elemsize;
            sVar9 = top_blob->elemsize;
            pvVar20 = bottom_blob->data;
            iVar5 = this->out_h;
            iVar31 = this->out_d;
            local_1c8 = (void *)0x0;
            do {
              if (0 < iVar31) {
                lVar15 = sVar7 * sVar8 * (long)local_1c8;
                local_1f8 = (void *)(sVar6 * sVar9 * (long)local_1c8 + (long)pvVar35);
                uVar4 = this->out_w;
                iVar24 = 0;
                do {
                  uVar25 = (long)(iVar24 * iVar3) / (long)iVar31;
                  iVar24 = iVar24 + 1;
                  uVar32 = (iVar24 * iVar3 + iVar31 + -1) / iVar31;
                  if (0 < iVar5) {
                    iVar22 = (int)uVar25;
                    iVar11 = 0;
                    do {
                      uVar27 = (long)(iVar11 * iVar2) / (long)iVar5;
                      iVar11 = iVar11 + 1;
                      uVar34 = (iVar11 * iVar2 + iVar5 + -1) / iVar5;
                      if (0 < (int)uVar4) {
                        iVar29 = (int)uVar27;
                        uVar14 = 0;
                        do {
                          uVar17 = uVar25 & 0xffffffff;
                          iVar18 = (iVar19 * (int)uVar14) / (int)uVar4;
                          uVar16 = uVar14 + 1;
                          iVar12 = iVar18 + (iVar22 * iVar2 + iVar29) * iVar19;
                          fVar41 = *(float *)((long)pvVar20 + (long)iVar12 * 4 + lVar15);
                          if (iVar22 < (int)uVar32) {
                            iVar30 = (int)(iVar19 * (int)uVar16 + (uVar4 - 1)) / (int)uVar4;
                            do {
                              uVar37 = uVar27 & 0xffffffff;
                              iVar13 = iVar12;
                              if (iVar29 < (int)uVar34) {
                                do {
                                  lVar21 = (long)iVar30 - (long)iVar18;
                                  iVar33 = iVar13;
                                  if (iVar18 < iVar30) {
                                    do {
                                      fVar1 = *(float *)((long)pvVar20 + (long)iVar33 * 4 + lVar15);
                                      if (fVar41 <= fVar1) {
                                        fVar41 = fVar1;
                                      }
                                      iVar33 = iVar33 + 1;
                                      lVar21 = lVar21 + -1;
                                    } while (lVar21 != 0);
                                  }
                                  uVar36 = (int)uVar37 + 1;
                                  uVar37 = (ulong)uVar36;
                                  iVar13 = iVar13 + iVar19;
                                } while (uVar36 != uVar34);
                              }
                              uVar36 = (int)uVar17 + 1;
                              uVar17 = (ulong)uVar36;
                              iVar12 = iVar12 + iVar2 * iVar19;
                            } while (uVar36 != uVar32);
                          }
                          *(float *)((long)local_1f8 + uVar14 * 4) = fVar41;
                          uVar14 = uVar16;
                        } while (uVar16 != uVar4);
                      }
                      local_1f8 = (void *)((long)local_1f8 + (long)(int)uVar4 * 4);
                    } while (iVar11 != iVar5);
                  }
                } while (iVar24 != iVar31);
              }
              local_1c8 = (void *)((long)local_1c8 + 1);
              iVar24 = 0;
            } while (local_1c8 != (void *)uVar39);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar4)) {
          sVar7 = bottom_blob->cstep;
          sVar8 = bottom_blob->elemsize;
          sVar9 = top_blob->elemsize;
          pvVar20 = bottom_blob->data;
          iVar5 = this->out_h;
          iVar31 = this->out_d;
          local_1c8 = (void *)0x0;
          do {
            if (0 < iVar31) {
              local_1d8 = (void *)(sVar6 * sVar9 * (long)local_1c8 + (long)pvVar35);
              uVar4 = this->out_w;
              iVar24 = 0;
              do {
                iVar22 = (iVar24 * iVar3) / iVar31;
                iVar24 = iVar24 + 1;
                iVar11 = (iVar24 * iVar3 + iVar31 + -1) / iVar31;
                if (0 < iVar5) {
                  iVar29 = 0;
                  do {
                    uVar25 = (long)(iVar29 * iVar2) / (long)iVar5;
                    iVar29 = iVar29 + 1;
                    uVar32 = (iVar29 * iVar2 + iVar5 + -1) / iVar5;
                    if (0 < (int)uVar4) {
                      iVar18 = (int)uVar25;
                      uVar27 = 0;
                      do {
                        iVar30 = (iVar19 * (int)uVar27) / (int)uVar4;
                        uVar14 = uVar27 + 1;
                        iVar12 = (int)((int)uVar14 * iVar19 + (uVar4 - 1)) / (int)uVar4;
                        fVar41 = 0.0;
                        if (iVar22 < iVar11) {
                          iVar33 = (iVar2 * iVar22 + iVar18) * iVar19 + iVar30;
                          iVar13 = iVar22;
                          do {
                            uVar16 = uVar25 & 0xffffffff;
                            iVar23 = iVar33;
                            if (iVar18 < (int)uVar32) {
                              do {
                                lVar15 = (long)iVar12 - (long)iVar30;
                                iVar38 = iVar23;
                                if (iVar30 < iVar12) {
                                  do {
                                    fVar41 = fVar41 + *(float *)((long)pvVar20 +
                                                                (long)iVar38 * 4 +
                                                                sVar7 * sVar8 * (long)local_1c8);
                                    iVar38 = iVar38 + 1;
                                    lVar15 = lVar15 + -1;
                                  } while (lVar15 != 0);
                                }
                                uVar34 = (int)uVar16 + 1;
                                uVar16 = (ulong)uVar34;
                                iVar23 = iVar23 + iVar19;
                              } while (uVar34 != uVar32);
                            }
                            iVar13 = iVar13 + 1;
                            iVar33 = iVar33 + iVar2 * iVar19;
                          } while (iVar13 != iVar11);
                        }
                        *(float *)((long)local_1d8 + uVar27 * 4) =
                             fVar41 / ((float)(iVar12 - iVar30) *
                                      (float)(int)(uVar32 - iVar18) * (float)(iVar11 - iVar22));
                        uVar27 = uVar14;
                      } while (uVar14 != uVar4);
                    }
                    local_1d8 = (void *)((long)local_1d8 + (long)(int)uVar4 * 4);
                  } while (iVar29 != iVar5);
                }
              } while (iVar24 != iVar31);
            }
            local_1c8 = (void *)((long)local_1c8 + 1);
            iVar24 = 0;
          } while (local_1c8 != (void *)uVar39);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar4,sVar6,opt->blob_allocator);
    pvVar35 = top_blob->data;
    iVar24 = -100;
    if ((pvVar35 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar32 = iVar2 * iVar19 * iVar3;
      if (this->pooling_type == 0) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        lVar15 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar20 = bottom_blob->data;
        uVar25 = 0;
        pvVar28 = pvVar20;
        do {
          fVar41 = *(float *)((long)pvVar20 + lVar15 * uVar25);
          if (0 < (int)uVar32) {
            uVar27 = 0;
            do {
              fVar1 = *(float *)((long)pvVar28 + uVar27 * 4);
              if (fVar41 <= fVar1) {
                fVar41 = fVar1;
              }
              uVar27 = uVar27 + 1;
            } while (uVar32 != uVar27);
          }
          *(float *)((long)pvVar35 + uVar25 * 4) = fVar41;
          uVar25 = uVar25 + 1;
          pvVar28 = (void *)((long)pvVar28 + lVar15);
        } while (uVar25 != uVar39);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        sVar6 = bottom_blob->cstep;
        sVar7 = bottom_blob->elemsize;
        pvVar20 = bottom_blob->data;
        uVar25 = 0;
        do {
          fVar41 = 0.0;
          if (0 < (int)uVar32) {
            uVar27 = 0;
            do {
              fVar41 = fVar41 + *(float *)((long)pvVar20 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar32 != uVar27);
          }
          *(float *)((long)pvVar35 + uVar25 * 4) = fVar41 * (1.0 / (float)(int)uVar32);
          uVar25 = uVar25 + 1;
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar25 != uVar39);
      }
      iVar24 = 0;
    }
  }
  return iVar24;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}